

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

bool __thiscall
dxil_spv::CFGNode::can_backtrace_to_with_blockers
          (CFGNode *this,CFGNode *parent,Vector<CFGNode_*> *block_nodes)

{
  undefined1 local_60 [8];
  UnorderedSet<const_CFGNode_*> node_cache;
  Vector<CFGNode_*> *block_nodes_local;
  CFGNode *parent_local;
  CFGNode *this_local;
  
  if (parent->forward_post_visit_order < this->forward_post_visit_order) {
    this_local._7_1_ = false;
  }
  else {
    node_cache._M_h._M_single_bucket = (__node_base_ptr)block_nodes;
    std::
    unordered_set<const_dxil_spv::CFGNode_*,_std::hash<const_dxil_spv::CFGNode_*>,_std::equal_to<const_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>_>
    ::unordered_set((unordered_set<const_dxil_spv::CFGNode_*,_std::hash<const_dxil_spv::CFGNode_*>,_std::equal_to<const_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>_>
                     *)local_60);
    this_local._7_1_ =
         can_backtrace_to_with_blockers
                   (this,parent,(Vector<CFGNode_*> *)node_cache._M_h._M_single_bucket,
                    (UnorderedSet<const_CFGNode_*> *)local_60);
    std::
    unordered_set<const_dxil_spv::CFGNode_*,_std::hash<const_dxil_spv::CFGNode_*>,_std::equal_to<const_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>_>
    ::~unordered_set((unordered_set<const_dxil_spv::CFGNode_*,_std::hash<const_dxil_spv::CFGNode_*>,_std::equal_to<const_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>_>
                      *)local_60);
  }
  return this_local._7_1_;
}

Assistant:

bool CFGNode::can_backtrace_to_with_blockers(const CFGNode *parent, const Vector<CFGNode *> &block_nodes) const
{
	// If parent can branch to this, then post_order(parent) must be greater than post_order(this).
	if (parent->forward_post_visit_order < forward_post_visit_order)
		return false;

	UnorderedSet<const CFGNode *> node_cache;
	return can_backtrace_to_with_blockers(parent, block_nodes, node_cache);
}